

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::enableUndoRedo(QTextDocumentPrivate *this,bool enable)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  if (((int)CONCAT71(in_register_00000031,enable) == 0) || (this->maximumBlockCount < 1)) {
    if (!enable) {
      this->undoState = 0;
      clearUndoRedoStacks(this,RedoStack,false);
      emitUndoAvailable(this,false);
      emitRedoAvailable(this,false);
      if (this->modified == false) {
        iVar1 = this->undoState;
      }
      else {
        iVar1 = -1;
      }
      this->modifiedState = iVar1;
      this->undoEnabled = enable;
      compressPieceTable(this);
      return;
    }
    if (this->modified == false) {
      iVar1 = this->undoState;
    }
    else {
      iVar1 = -1;
    }
    this->modifiedState = iVar1;
    this->undoEnabled = enable;
  }
  return;
}

Assistant:

void QTextDocumentPrivate::enableUndoRedo(bool enable)
{
    if (enable && maximumBlockCount > 0)
        return;

    if (!enable) {
        undoState = 0;
        clearUndoRedoStacks(QTextDocument::RedoStack);
        emitUndoAvailable(false);
        emitRedoAvailable(false);
    }
    modifiedState = modified ? -1 : undoState;
    undoEnabled = enable;
    if (!undoEnabled)
        compressPieceTable();
}